

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  ParamIterator<BLOCK_SIZE> *in_RDI;
  bool dummy [2];
  bool at_end;
  undefined1 local_21;
  undefined4 in_stack_fffffffffffffff0;
  undefined1 uVar1;
  undefined1 in_stack_fffffffffffffff5;
  undefined1 in_stack_fffffffffffffff6;
  undefined1 uVar2;
  undefined1 uVar3;
  
  uVar2 = 0;
  uVar1 = 1;
  std::
  get<0ul,testing::internal::ParamIterator<void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
            ((tuple<testing::internal::ParamIterator<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
              *)0xacb363);
  std::
  get<0ul,testing::internal::ParamIterator<void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
            ((tuple<testing::internal::ParamIterator<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
              *)0xacb376);
  uVar1 = ParamIterator<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int)>
          ::operator==((ParamIterator<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int)>
                        *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffff6,
                                                  CONCAT15(in_stack_fffffffffffffff5,
                                                           CONCAT14(uVar1,in_stack_fffffffffffffff0)
                                                          ))),
                       (ParamIterator<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int)>
                        *)in_RDI);
  local_21 = true;
  if (!(bool)uVar1) {
    uVar2 = uVar1;
    uVar3 = uVar1;
    std::
    get<1ul,testing::internal::ParamIterator<void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
              ((tuple<testing::internal::ParamIterator<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
                *)0xacb3c3);
    std::
    get<1ul,testing::internal::ParamIterator<void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
              ((tuple<testing::internal::ParamIterator<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
                *)0xacb3d5);
    local_21 = ParamIterator<BLOCK_SIZE>::operator==
                         ((ParamIterator<BLOCK_SIZE> *)
                          CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffff6,
                                                  CONCAT15(uVar2,CONCAT14(uVar1,
                                                  in_stack_fffffffffffffff0)))),in_RDI);
  }
  return local_21;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }